

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,RangeValue *other)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  undefined8 extraout_RAX;
  size_t other_00;
  RangeValue RVar3;
  RangeValue RVar4;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  RangeValue *local_28;
  RangeValue *other_local;
  RangeValue *this_local;
  size_t local_10;
  
  local_28 = other;
  other_local = this;
  bVar1 = isUnbound(other);
  if ((bVar1) && (bVar1 = isUnbound(this), !bVar1)) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"Subtracting unbound range ");
    poVar2 = ::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2," from bound range ");
    ::operator<<(poVar2,this);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1e0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = isUnbound(local_28);
  if (bVar1) {
    RangeValue((RangeValue *)&this_local);
    RVar3._val = local_10;
    RVar3._0_8_ = extraout_RAX;
  }
  else {
    other_00 = value(local_28);
    RVar3 = operator-(this,other_00);
    this_local._0_1_ = RVar3._isUnbound;
  }
  local_10 = RVar3._val;
  RVar4._1_7_ = RVar3._1_7_;
  RVar4._isUnbound = (bool)this_local._0_1_;
  RVar4._val = local_10;
  return RVar4;
}

Assistant:

RangeValue RangeValue::operator- (const RangeValue& other) const {
    if (other.isUnbound() && !(this->isUnbound())) {
        std::stringstream ss;
        ss << "Subtracting unbound range " << other << " from bound range " << *this;
        throw std::runtime_error(ss.str());
    }
    else if (other.isUnbound()) {
        // both unbound
        return RangeValue();
    }
    else {
        return (*this)-other.value();
    }
}